

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O3

void Abc_NtkCecFraigPart(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int nPartSize,int fVerbose)

{
  uint *puVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  int iVar3;
  Abc_Ntk_t *pMiter;
  int *piVar4;
  Abc_Frame_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  Abc_Ntk_t *pMiterPart;
  Prove_Params_t Params;
  int local_9c;
  Abc_Ntk_t *local_98;
  Abc_Ntk_t *local_90;
  Prove_Params_t local_88;
  
  Prove_ParamsSetDefault(&local_88);
  local_88.nItersMax = 5;
  if (nPartSize < 1) {
    __assert_fail("nPartSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                  ,0x107,"void Abc_NtkCecFraigPart(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int)");
  }
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,1,nPartSize,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    puts("Miter computation has failed.");
    return;
  }
  iVar3 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar3 == 1) {
    pcVar8 = "Networks are equivalent after structural hashing.";
  }
  else {
    if (iVar3 == 0) {
      puts("Networks are NOT EQUIVALENT after structural hashing.");
      piVar4 = (int *)calloc(1,(long)pMiter->vCis->nSize << 2);
      pMiter->pModel = piVar4;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,piVar4);
      if (pMiter->pModel != (int *)0x0) {
        free(pMiter->pModel);
        pMiter->pModel = (int *)0x0;
      }
      goto LAB_002b8567;
    }
    pAVar5 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar5,"unset progressbar");
    pVVar6 = pMiter->vPos;
    if (pVVar6->nSize < 1) {
      pAVar5 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar5,"set progressbar");
    }
    else {
      local_9c = 1;
      lVar10 = 0;
      uVar9 = 0;
      local_90 = pNtk1;
      do {
        pObj = (Abc_Obj_t *)pVVar6->pArray[lVar10];
        pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
        pAVar7 = Abc_AigConst1(pMiter);
        if (pAVar2 == pAVar7) {
          local_98 = (Abc_Ntk_t *)0x0;
          if ((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0) goto LAB_002b85a6;
LAB_002b84c8:
          printf("Finished part %5d (out of %5d)\r",(ulong)((int)lVar10 + 1),
                 (ulong)(uint)pMiter->vPos->nSize);
          uVar9 = uVar9 + nPartSize;
        }
        else {
          pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
          pcVar8 = Abc_ObjName(pObj);
          local_98 = Abc_NtkCreateCone(pMiter,pAVar2,pcVar8,0);
          if ((pObj->field_0x15 & 4) != 0) {
            if (local_98->vPos->nSize < 1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar1 = (uint *)((long)*local_98->vPos->pArray + 0x14);
            *puVar1 = *puVar1 ^ 0x400;
          }
          iVar3 = Abc_NtkIvyProve(&local_98,&local_88);
          if (iVar3 != -1) {
            if (iVar3 != 0) goto LAB_002b84c8;
LAB_002b85a6:
            piVar4 = Abc_NtkVerifySimulatePattern(local_98,local_98->pModel);
            pcVar8 = "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.";
            if (*piVar4 == 1) {
              pcVar8 = "Networks are NOT EQUIVALENT.                 ";
            }
            puts(pcVar8);
            free(piVar4);
            pAVar5 = Abc_FrameGetGlobalFrame();
            Cmd_CommandExecute(pAVar5,"set progressbar");
            goto LAB_002b8567;
          }
          printf("Networks are undecided (resource limits is reached).\r");
          local_9c = -1;
        }
        if (local_98 != (Abc_Ntk_t *)0x0) {
          Abc_NtkDelete(local_98);
        }
        lVar10 = lVar10 + 1;
        pVVar6 = pMiter->vPos;
      } while (lVar10 < pVVar6->nSize);
      pAVar5 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar5,"set progressbar");
      if (local_9c == -1) {
        printf("Timed out after verifying %d outputs (out of %d).\n",(ulong)uVar9,
               (ulong)(uint)local_90->vCos->nSize);
        goto LAB_002b8567;
      }
      if (local_9c != 1) goto LAB_002b8567;
    }
    pcVar8 = "Networks are equivalent.                         ";
  }
  puts(pcVar8);
LAB_002b8567:
  Abc_NtkDelete(pMiter);
  return;
}

Assistant:

void Abc_NtkCecFraigPart( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nPartSize, int fVerbose )
{
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pMiter, * pMiterPart;
    Abc_Obj_t * pObj;
    int i, RetValue, Status, nOutputs;

    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
    //    pParams->fVerbose = 1;

    assert( nPartSize > 0 );

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, nPartSize, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.\n" );
        Abc_NtkDelete( pMiter );
        return;
    }

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // solve the problem iteratively for each output of the miter
    Status = 1;
    nOutputs = 0;
    Abc_NtkForEachPo( pMiter, pObj, i )
    {
        if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pMiter) )
        {
            if ( Abc_ObjFaninC0(pObj) ) // complemented -> const 0
                RetValue = 1;
            else
                RetValue = 0;
            pMiterPart = NULL;
        }
        else
        {
            // get the cone of this output
            pMiterPart = Abc_NtkCreateCone( pMiter, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 0 );
            if ( Abc_ObjFaninC0(pObj) )
                Abc_ObjXorFaninC( Abc_NtkPo(pMiterPart,0), 0 );
            // solve the cone
        //    RetValue = Abc_NtkMiterProve( &pMiterPart, pParams );
            RetValue = Abc_NtkIvyProve( &pMiterPart, pParams );
        }

        if ( RetValue == -1 )
        {
            printf( "Networks are undecided (resource limits is reached).\r" );
            Status = -1;
        }
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiterPart, pMiterPart->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
            else
                printf( "Networks are NOT EQUIVALENT.                 \n" );
            ABC_FREE( pSimInfo );
            Status = 0;
            break;
        }
        else
        {
            printf( "Finished part %5d (out of %5d)\r", i+1, Abc_NtkPoNum(pMiter) );
            nOutputs += nPartSize;
        }
//        if ( pMiter->pModel )
//            Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        if ( pMiterPart )
            Abc_NtkDelete( pMiterPart );
    }
  
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    if ( Status == 1 )
        printf( "Networks are equivalent.                         \n" );
    else if ( Status == -1 )
        printf( "Timed out after verifying %d outputs (out of %d).\n", nOutputs, Abc_NtkCoNum(pNtk1) );
    Abc_NtkDelete( pMiter );
}